

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

bool __thiscall
wasm::OptimizeInstructions::trapOnNull(OptimizeInstructions *this,Expression *curr,Expression **ref)

{
  Index *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Module *wasm;
  PassOptions *pPVar4;
  Drop *pDVar5;
  Drop *pDVar6;
  Block *pBVar7;
  RefCast *pRVar8;
  Expression **ppEVar9;
  HeapType heapType;
  Expression *pEVar10;
  Iterator IVar11;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  optional<wasm::Type> type_02;
  bool local_381;
  bool local_331;
  bool local_311;
  Expression *fallthrough;
  Type local_2d8;
  byte local_2c9;
  EffectAnalyzer local_2c8;
  Expression *local_168;
  Expression *child;
  Self *local_158;
  Index local_150;
  undefined1 local_148 [8];
  Iterator __end4;
  undefined1 local_118 [8];
  Iterator __begin4;
  ChildIterator *__range4;
  bool seenRef;
  bool canOptimize;
  RefCast *cast;
  optional<wasm::Type> local_a8;
  BasicType local_98 [2];
  optional<wasm::Type> local_90;
  BasicType local_7c;
  Select *local_78;
  Select *select;
  optional<wasm::Type> local_68;
  optional<wasm::Type> local_50;
  If *local_40;
  If *iff;
  anon_class_8_1_8991fb9c flowsOutNull;
  Builder builder;
  Expression **ref_local;
  Expression *curr_local;
  OptimizeInstructions *this_local;
  
  wasm = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
         getModule(&(this->
                    super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                    ).
                    super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                    .
                    super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                  );
  Builder::Builder((Builder *)&flowsOutNull,wasm);
  pPVar4 = Pass::getPassOptions((Pass *)this);
  if ((pPVar4->trapsNeverHappen & 1U) != 0) {
    iff = (If *)this;
    local_40 = Expression::dynCast<wasm::If>(*ref);
    if ((local_40 != (If *)0x0) && (local_40->ifFalse != (Expression *)0x0)) {
      bVar2 = trapOnNull::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)&iff,local_40->ifTrue);
      if (bVar2) {
        bVar2 = wasm::Type::operator!=(&(*ref)->type,&local_40->ifFalse->type);
        if (bVar2) {
          this->refinalize = true;
        }
        pDVar5 = Builder::makeDrop((Builder *)&flowsOutNull,local_40->condition);
        pEVar10 = local_40->ifFalse;
        std::optional<wasm::Type>::optional(&local_50);
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._9_7_ = 0;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             local_50.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_payload;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged =
             local_50.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_engaged;
        pBVar7 = Builder::makeSequence((Builder *)&flowsOutNull,(Expression *)pDVar5,pEVar10,type);
        *ref = (Expression *)pBVar7;
        return false;
      }
      bVar2 = trapOnNull::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)&iff,local_40->ifFalse);
      if (bVar2) {
        bVar2 = wasm::Type::operator!=(&(*ref)->type,&local_40->ifTrue->type);
        if (bVar2) {
          this->refinalize = true;
        }
        pDVar5 = Builder::makeDrop((Builder *)&flowsOutNull,local_40->condition);
        pEVar10 = local_40->ifTrue;
        std::optional<wasm::Type>::optional(&local_68);
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._9_7_ = 0;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             local_68.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_payload;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged =
             local_68.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_engaged;
        pBVar7 = Builder::makeSequence
                           ((Builder *)&flowsOutNull,(Expression *)pDVar5,pEVar10,type_00);
        *ref = (Expression *)pBVar7;
        return false;
      }
    }
    local_78 = Expression::dynCast<wasm::Select>(*ref);
    if (local_78 != (Select *)0x0) {
      bVar2 = trapOnNull::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)&iff,local_78->ifTrue);
      local_311 = false;
      if (bVar2) {
        local_7c = unreachable;
        local_311 = wasm::Type::operator!=(&local_78->ifFalse->type,&local_7c);
      }
      if (local_311 != false) {
        pDVar5 = Builder::makeDrop((Builder *)&flowsOutNull,local_78->ifTrue);
        pEVar10 = local_78->ifFalse;
        pDVar6 = Builder::makeDrop((Builder *)&flowsOutNull,local_78->condition);
        pEVar10 = getResultOfFirst(this,pEVar10,(Expression *)pDVar6);
        std::optional<wasm::Type>::optional(&local_90);
        type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._9_7_ = 0;
        type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             local_90.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_payload;
        type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged =
             local_90.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_engaged;
        pBVar7 = Builder::makeSequence
                           ((Builder *)&flowsOutNull,(Expression *)pDVar5,pEVar10,type_01);
        *ref = (Expression *)pBVar7;
        return false;
      }
      bVar2 = trapOnNull::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)&iff,local_78->ifFalse);
      local_331 = false;
      if (bVar2) {
        local_98[0] = unreachable;
        local_331 = wasm::Type::operator!=(&local_78->ifTrue->type,local_98);
      }
      if (local_331 != false) {
        pEVar10 = local_78->ifTrue;
        pDVar5 = Builder::makeDrop((Builder *)&flowsOutNull,local_78->ifFalse);
        pDVar6 = Builder::makeDrop((Builder *)&flowsOutNull,local_78->condition);
        std::optional<wasm::Type>::optional(&local_a8);
        type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._9_7_ = 0;
        type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             local_a8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_payload;
        type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged =
             local_a8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_engaged;
        pBVar7 = Builder::makeSequence
                           ((Builder *)&flowsOutNull,(Expression *)pDVar5,(Expression *)pDVar6,
                            type_02);
        pEVar10 = getResultOfFirst(this,pEVar10,(Expression *)pBVar7);
        *ref = pEVar10;
        return false;
      }
    }
  }
  bVar2 = wasm::Type::isNullable(&(*ref)->type);
  if ((bVar2) && (pRVar8 = Expression::dynCast<wasm::RefCast>(*ref), pRVar8 != (RefCast *)0x0)) {
    bVar1 = true;
    bVar2 = false;
    this_00 = &__begin4.index;
    ChildIterator::ChildIterator((ChildIterator *)this_00,curr);
    IVar11 = AbstractChildIterator<wasm::ChildIterator>::begin
                       ((AbstractChildIterator<wasm::ChildIterator> *)this_00);
    __end4._8_8_ = IVar11.parent;
    __begin4.parent._0_4_ = IVar11.index;
    local_118 = (undefined1  [8])__end4._8_8_;
    IVar11 = AbstractChildIterator<wasm::ChildIterator>::end
                       ((AbstractChildIterator<wasm::ChildIterator> *)this_00);
    local_158 = IVar11.parent;
    local_150 = IVar11.index;
    local_148 = (undefined1  [8])local_158;
    __end4.parent._0_4_ = local_150;
    while (bVar3 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator!=
                             ((Iterator *)local_118,(Iterator *)local_148), bVar3) {
      ppEVar9 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                          ((Iterator *)local_118);
      local_168 = *ppEVar9;
      if (local_168 == *ref) {
        bVar2 = true;
      }
      else if (bVar2) {
        pPVar4 = Pass::getPassOptions((Pass *)this);
        local_2c9 = 0;
        local_381 = true;
        if ((pPVar4->trapsNeverHappen & 1U) != 0) {
          effects(&local_2c8,this,local_168);
          local_2c9 = 1;
          local_381 = EffectAnalyzer::transfersControlFlow(&local_2c8);
        }
        if ((local_2c9 & 1) != 0) {
          EffectAnalyzer::~EffectAnalyzer(&local_2c8);
        }
        if (local_381 != false) {
          bVar1 = false;
          break;
        }
      }
      AbstractChildIterator<wasm::ChildIterator>::Iterator::operator++((Iterator *)local_118);
    }
    child._4_4_ = 2;
    ChildIterator::~ChildIterator((ChildIterator *)&__begin4.index);
    if (bVar1) {
      heapType = wasm::Type::getHeapType
                           (&(pRVar8->super_SpecificExpression<(wasm::Expression::Id)63>).
                             super_Expression.type);
      wasm::Type::Type(&local_2d8,heapType,NonNullable,Inexact);
      (pRVar8->super_SpecificExpression<(wasm::Expression::Id)63>).super_Expression.type.id =
           local_2d8.id;
    }
  }
  pEVar10 = getFallthrough(this,*ref);
  bVar2 = wasm::Type::isNull(&pEVar10->type);
  if (bVar2) {
    pEVar10 = (Expression *)Builder::makeUnreachable((Builder *)&flowsOutNull);
    pEVar10 = getDroppedChildrenAndAppend(this,curr,pEVar10);
    replaceCurrent(this,pEVar10);
  }
  return bVar2;
}

Assistant:

bool trapOnNull(Expression* curr, Expression*& ref) {
    Builder builder(*getModule());

    if (getPassOptions().trapsNeverHappen) {
      // We can ignore the possibility of the reference being an input, so
      //
      //    (if
      //      (condition)
      //      (null)
      //      (other))
      // =>
      //    (drop
      //      (condition))
      //    (other)
      //
      // That is, we will by assumption not read from the null, so remove that
      // arm.
      //
      // TODO We could recurse here.
      // TODO We could do similar things for casts (rule out an impossible arm).
      // TODO Worth thinking about an 'assume' instrinsic of some form that
      //      annotates knowledge about a value, or another mechanism to allow
      //      that information to be passed around.

      // Note that we must check that the null is actually flowed out, that is,
      // that control flow is not transferred before:
      //
      //    (if
      //      (1)
      //      (block (result null)
      //        (return)
      //      )
      //      (other))
      //
      // The true arm has a bottom type, but in fact it just returns out of the
      // function and the null does not actually flow out. We can only optimize
      // here if a null definitely flows out (as only that would cause a trap).
      auto flowsOutNull = [&](Expression* child) {
        return child->type.isNull() && !effects(child).transfersControlFlow();
      };

      if (auto* iff = ref->dynCast<If>()) {
        if (iff->ifFalse) {
          if (flowsOutNull(iff->ifTrue)) {
            if (ref->type != iff->ifFalse->type) {
              refinalize = true;
            }
            ref = builder.makeSequence(builder.makeDrop(iff->condition),
                                       iff->ifFalse);
            return false;
          }
          if (flowsOutNull(iff->ifFalse)) {
            if (ref->type != iff->ifTrue->type) {
              refinalize = true;
            }
            ref = builder.makeSequence(builder.makeDrop(iff->condition),
                                       iff->ifTrue);
            return false;
          }
        }
      }

      if (auto* select = ref->dynCast<Select>()) {
        // We must check for unreachability explicitly here because a full
        // refinalize only happens at the end. That is, the select may stil be
        // reachable after we turned one child into an unreachable, and we are
        // calling getResultOfFirst which will error on unreachability.
        if (flowsOutNull(select->ifTrue) &&
            select->ifFalse->type != Type::unreachable) {
          ref = builder.makeSequence(
            builder.makeDrop(select->ifTrue),
            getResultOfFirst(select->ifFalse,
                             builder.makeDrop(select->condition)));
          return false;
        }
        if (flowsOutNull(select->ifFalse) &&
            select->ifTrue->type != Type::unreachable) {
          ref = getResultOfFirst(
            select->ifTrue,
            builder.makeSequence(builder.makeDrop(select->ifFalse),
                                 builder.makeDrop(select->condition)));
          return false;
        }
      }
    }

    // A nullable cast can be turned into a non-nullable one:
    //
    //    (struct.get ;; or something else that traps on a null ref
    //      (ref.cast null
    // =>
    //    (struct.get
    //      (ref.cast      ;; now non-nullable
    //
    // Either way we trap here, but refining the type may have benefits later.
    if (ref->type.isNullable()) {
      if (auto* cast = ref->dynCast<RefCast>()) {
        // Note that we must be the last child of the parent, otherwise effects
        // in the middle may need to remain:
        //
        //    (struct.set
        //      (ref.cast null
        //      (call ..
        //
        // The call here must execute before the trap in the struct.set. To
        // avoid that problem, inspect all children after us. If there are no
        // such children, then there is no problem; if there are, see below.
        auto canOptimize = true;
        auto seenRef = false;
        for (auto* child : ChildIterator(curr)) {
          if (child == ref) {
            seenRef = true;
          } else if (seenRef) {
            // This is a child after the reference. Check it for effects. For
            // simplicity, focus on the case of traps-never-happens: if we can
            // assume no trap occurs in the parent, then there must not be a
            // trap in the child either, unless control flow transfers and we
            // might not reach the parent.
            // TODO: handle more cases.
            if (!getPassOptions().trapsNeverHappen ||
                effects(child).transfersControlFlow()) {
              canOptimize = false;
              break;
            }
          }
        }
        if (canOptimize) {
          cast->type = Type(cast->type.getHeapType(), NonNullable);
        }
      }
    }

    auto fallthrough = getFallthrough(ref);

    if (fallthrough->type.isNull()) {
      replaceCurrent(
        getDroppedChildrenAndAppend(curr, builder.makeUnreachable()));
      return true;
    }
    return false;
  }